

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O2

exr_result_t
internal_decode_free_buffer
          (exr_decode_pipeline_t *decode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *sz)

{
  uint uVar1;
  void *pvVar2;
  exr_const_context_t p_Var3;
  exr_result_t eVar4;
  
  pvVar2 = *buf;
  if (pvVar2 != (void *)0x0) {
    if (*sz != 0) {
      if (decode->free_fn == (_func_void_exr_transcoding_pipeline_buffer_id_t_void_ptr *)0x0) {
        p_Var3 = decode->context;
        if (p_Var3 == (exr_const_context_t)0x0) {
          return 2;
        }
        uVar1 = decode->part_index;
        if (((int)uVar1 < 0) || (p_Var3->num_parts <= (int)uVar1)) {
          eVar4 = (*p_Var3->print_error)
                            (p_Var3,4,"Part index (%d) out of range",(ulong)uVar1,
                             p_Var3->print_error);
          return eVar4;
        }
        (*p_Var3->free_fn)(pvVar2);
      }
      else {
        (*decode->free_fn)(bufid,pvVar2);
      }
    }
    *buf = (void *)0x0;
  }
  *sz = 0;
  return 0;
}

Assistant:

exr_result_t
internal_decode_free_buffer (
    exr_decode_pipeline_t*               decode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              sz)
{
    void*  curbuf = *buf;
    size_t cursz  = *sz;
    if (curbuf)
    {
        if (cursz > 0)
        {
            if (decode->free_fn)
                decode->free_fn (bufid, curbuf);
            else
            {
                exr_const_context_t ctxt = decode->context;
                EXR_CHECK_CONTEXT_AND_PART (decode->part_index);

                ctxt->free_fn (curbuf);
            }
        }
        *buf = NULL;
    }
    *sz = 0;
    return EXR_ERR_SUCCESS;
}